

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int __thiscall ON_String::Replace(ON_String *this,char utf8_single_byte_c1,char utf8_single_byte_c2)

{
  int iVar1;
  int local_1c;
  int local_18;
  int i;
  int count;
  char utf8_single_byte_c2_local;
  char utf8_single_byte_c1_local;
  ON_String *this_local;
  
  local_18 = 0;
  iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c1);
  if ((iVar1 != 0) && (iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c2), iVar1 != 0))
  {
    local_1c = Length(this);
    while (iVar1 = local_1c + -1, local_1c != 0) {
      local_1c = iVar1;
      if (utf8_single_byte_c1 == this->m_s[iVar1]) {
        if (local_18 == 0) {
          CopyArray(this);
        }
        this->m_s[iVar1] = utf8_single_byte_c2;
        local_18 = local_18 + 1;
      }
    }
  }
  return local_18;
}

Assistant:

int ON_String::Replace(char utf8_single_byte_c1, char utf8_single_byte_c2)
{
  int count = 0;
  if (ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c1) && ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c2))
  {
    int i = Length();
    while (i--)
    {
      if (utf8_single_byte_c1 == m_s[i])
      {
        if (0 == count)
          CopyArray();
        m_s[i] = utf8_single_byte_c2;
        count++;
      }
    }
  }
  return count;
}